

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O2

void __thiscall wasm::Analyzer::useRefFunc(Analyzer *this,Name func)

{
  char **__k;
  ModuleElement element_00;
  Function *pFVar1;
  size_type sVar2;
  size_type sVar3;
  _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  char *pcVar4;
  ModuleItemKind MVar5;
  undefined4 uStack_54;
  ModuleItemKind MStack_50;
  undefined4 uStack_4c;
  undefined1 auStack_40 [8];
  ModuleElement element;
  HeapType type;
  Name func_local;
  
  pcVar4 = func.super_IString.str._M_str;
  type.id = func.super_IString.str._M_len;
  if (this->options->closedWorld == false) {
    MVar5 = Function;
    MStack_50 = (ModuleItemKind)func.super_IString.str._M_len;
    uStack_4c = func.super_IString.str._M_len._4_4_;
    auStack_40._4_4_ = uStack_54;
  }
  else {
    auStack_40._0_4_ = Function;
    element._0_8_ = type.id;
    element.second.super_IString.str._M_len = (size_t)pcVar4;
    pFVar1 = Module::getFunction(this->module,func);
    element.second.super_IString.str._M_str = (char *)(pFVar1->type).id;
    sVar2 = std::
            _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(&(this->calledSignatures)._M_h,
                    (key_type *)&element.second.super_IString.str._M_str);
    __k = &element.second.super_IString.str._M_str;
    if (sVar2 == 0) {
      this_00 = (_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)std::__detail::
                   _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->uncalledRefFuncMap,(key_type *)__k);
      std::__detail::
      _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert(this_00,(value_type *)&type);
      std::__detail::
      _Insert_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->referenced,(value_type *)auStack_40);
      return;
    }
    sVar3 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&(this->uncalledRefFuncMap)._M_h,(key_type *)__k);
    if (sVar3 != 0) {
      __assert_fail("uncalledRefFuncMap.count(type) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedModuleElements.cpp"
                    ,0x14c,"void wasm::Analyzer::useRefFunc(Name)");
    }
    MVar5 = auStack_40._0_4_;
    MStack_50 = element.first;
    uStack_4c = element._4_4_;
    pcVar4 = (char *)element.second.super_IString.str._M_len;
  }
  element_00._4_4_ = auStack_40._4_4_;
  element_00.first = MVar5;
  element_00.second.super_IString.str._M_len._0_4_ = MStack_50;
  element_00.second.super_IString.str._M_len._4_4_ = uStack_4c;
  element_00.second.super_IString.str._M_str = pcVar4;
  use(this,element_00);
  return;
}

Assistant:

void useRefFunc(Name func) {
    if (!options.closedWorld) {
      // The world is open, so assume the worst and something (inside or outside
      // of the module) can call this.
      use({ModuleElementKind::Function, func});
      return;
    }

    // Otherwise, we are in a closed world, and so we can try to optimize the
    // case where the target function is referenced but not used.
    auto element = ModuleElement{ModuleElementKind::Function, func};

    auto type = module->getFunction(func)->type;
    if (calledSignatures.count(type)) {
      // We must not have a type in both calledSignatures and
      // uncalledRefFuncMap: once it is called, we do not track RefFuncs for it
      // any more.
      assert(uncalledRefFuncMap.count(type) == 0);

      // We've seen a RefFunc for this, so it is used.
      use(element);
    } else {
      // We've never seen a CallRef for this, but might see one later.
      uncalledRefFuncMap[type].insert(func);

      referenced.insert(element);
    }
  }